

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O0

PulseStyleKind slang::ast::SemanticFacts::getPulseStyleKind(TokenKind kind)

{
  TokenKind kind_local;
  undefined4 local_4;
  
  if (kind == NoShowCancelledKeyword) {
    local_4 = NoShowCancelled;
  }
  else if (kind == PulseStyleOnDetectKeyword) {
    local_4 = OnDetect;
  }
  else if (kind == PulseStyleOnEventKeyword) {
    local_4 = OnEvent;
  }
  else {
    local_4 = ShowCancelled;
  }
  return local_4;
}

Assistant:

PulseStyleKind SemanticFacts::getPulseStyleKind(TokenKind kind) {
    switch (kind) {
        case TokenKind::PulseStyleOnEventKeyword: return PulseStyleKind::OnEvent;
        case TokenKind::PulseStyleOnDetectKeyword: return PulseStyleKind::OnDetect;
        case TokenKind::ShowCancelledKeyword: return PulseStyleKind::ShowCancelled;
        case TokenKind::NoShowCancelledKeyword: return PulseStyleKind::NoShowCancelled;
        default: SLANG_UNREACHABLE;
    }
}